

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O0

int opcode_dec(pt_ild *ild,uint8_t length)

{
  uint8_t uVar1;
  int iVar2;
  uint8_t m;
  uint8_t b;
  uint8_t length_local;
  pt_ild *ild_local;
  
  if (ild == (pt_ild *)0x0) {
    ild_local._4_4_ = -1;
  }
  else {
    uVar1 = get_byte(ild,length);
    if (uVar1 == '\x0f') {
      if ((byte)(length + 1) < ild->max_bytes) {
        uVar1 = get_byte(ild,length + 1);
        if (uVar1 == '8') {
          ild->map = '\x02';
          ild_local._4_4_ = get_next_as_opcode(ild,length + '\x02');
        }
        else if (uVar1 == ':') {
          ild->map = '\x03';
          ild->imm1_bytes = '\x01';
          ild_local._4_4_ = get_next_as_opcode(ild,length + '\x02');
        }
        else {
          iVar2 = bits_match(uVar1,0xf8,'8');
          if (iVar2 == 0) {
            ild->nominal_opcode = uVar1;
            ild->map = '\x01';
            ild_local._4_4_ = modrm_dec(ild,length + '\x02');
          }
          else {
            ild->map = '\b';
            ild_local._4_4_ = get_next_as_opcode(ild,length + '\x02');
          }
        }
      }
      else {
        ild_local._4_4_ = -0xe;
      }
    }
    else {
      ild->map = '\0';
      ild->nominal_opcode = uVar1;
      ild_local._4_4_ = modrm_dec(ild,length + '\x01');
    }
  }
  return ild_local._4_4_;
}

Assistant:

static int opcode_dec(struct pt_ild *ild, uint8_t length)
{
	uint8_t b, m;

	if (!ild)
		return -pte_internal;

	/*no need to check max_bytes - it was checked in previous scanners */
	b = get_byte(ild, length);
	if (b != 0x0F) {	/* 1B opcodes, map 0 */
		ild->map = PTI_MAP_0;
		ild->nominal_opcode = b;

		return modrm_dec(ild, length + 1);
	}

	length++;		/* eat the 0x0F */

	if (ild->max_bytes <= length)
		return -pte_bad_insn;

	/* 0x0F opcodes MAPS 1,2,3 */
	m = get_byte(ild, length);
	if (m == 0x38) {
		ild->map = PTI_MAP_2;

		return get_next_as_opcode(ild, length + 1);
	} else if (m == 0x3A) {
		ild->map = PTI_MAP_3;
		ild->imm1_bytes = 1;

		return get_next_as_opcode(ild, length + 1);
	} else if (bits_match(m, 0xf8, 0x38)) {
		ild->map = PTI_MAP_INVALID;

		return get_next_as_opcode(ild, length + 1);
	} else {	/* map 1 (simple two byte opcodes) */
		ild->nominal_opcode = m;
		ild->map = PTI_MAP_1;

		return modrm_dec(ild, length + 1);
	}
}